

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFilterDup.cpp
# Opt level: O2

bool __thiscall liblogger::LogFilterDup::Filter(LogFilterDup *this,LogType Type,string *str)

{
  LogType Type_00;
  __type _Var1;
  bool bVar2;
  ostream *poVar3;
  string sStack_1c8;
  stringstream ss;
  ostream local_198 [376];
  
  if (this->m_busy == false) {
    this->m_busy = true;
    if ((this->m_lasttype == Type) && (_Var1 = std::operator==(str,&this->m_last), _Var1)) {
      this->m_matched = this->m_matched + 1;
      bVar2 = true;
    }
    else {
      if (this->m_matched != 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar3 = std::operator<<(local_198,"Last message repeated ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->m_matched);
        std::operator<<(poVar3," times");
        Type_00 = this->m_lasttype;
        std::__cxx11::stringbuf::str();
        LogManager::Send(Type_00,&sStack_1c8);
        std::__cxx11::string::~string((string *)&sStack_1c8);
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      }
      this->m_matched = 0;
      std::__cxx11::string::_M_assign((string *)&this->m_last);
      this->m_lasttype = Type;
      bVar2 = false;
    }
    this->m_busy = false;
    return bVar2;
  }
  return false;
}

Assistant:

bool LogFilterDup::Filter(const LogType Type, const std::string &str)
{
	if (m_busy)
		return false; //Being reentered
	m_busy = true;
	try
	{
		if (Type == m_lasttype && str == m_last)
		{
			m_matched++;
			m_busy = false;
			return true;
		}
	
		if (m_matched)
		{
			std::stringstream ss;
			ss << "Last message repeated " << m_matched << " times";
			LogManager::Send(m_lasttype, ss.str());
		}
		m_matched = 0;
		m_last = str;
		m_lasttype = Type;
		m_busy = false;
		return false;
	}
	catch(std::exception &ex)
	{
		m_busy = false;
		throw(ex);
	}
}